

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_> * __thiscall
nuraft::raft_server::get_peer_info_all
          (vector<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
           *__return_storage_ptr__,raft_server *this)

{
  pointer *pppVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  iterator __position;
  unique_lock<std::recursive_mutex> guard;
  peer_info local_58;
  unique_lock<std::recursive_mutex> local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (((this->leader_).super___atomic_base<int>._M_i == this->id_) && ((this->role_)._M_i == leader)
     ) {
    local_40._M_device = &this->lock_;
    local_40._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_40);
    local_40._M_owns = true;
    for (p_Var2 = (this->peers_)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0;
        p_Var2 = p_Var2->_M_nxt) {
      p_Var3 = p_Var2[2]._M_nxt;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2[3]._M_nxt;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
            goto LAB_0015517e;
          }
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
LAB_0015517e:
      local_58.last_succ_resp_us_ = 0;
      local_58.id_ = *(int32 *)&p_Var3->_M_nxt->_M_nxt;
      local_58.last_log_idx_ = (ulong)p_Var3[0xe]._M_nxt;
      local_58.last_succ_resp_us_ = timer_helper::get_us((timer_helper *)(p_Var3 + 0x28));
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<nuraft::raft_server::peer_info,std::allocator<nuraft::raft_server::peer_info>>::
        _M_realloc_insert<nuraft::raft_server::peer_info_const&>
                  ((vector<nuraft::raft_server::peer_info,std::allocator<nuraft::raft_server::peer_info>>
                    *)__return_storage_ptr__,__position,&local_58);
      }
      else {
        (__position._M_current)->last_succ_resp_us_ = local_58.last_succ_resp_us_;
        *(ulong *)__position._M_current = CONCAT44(local_58._4_4_,local_58.id_);
        (__position._M_current)->last_log_idx_ = local_58.last_log_idx_;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<nuraft::raft_server::peer_info,_std::allocator<nuraft::raft_server::peer_info>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<raft_server::peer_info> raft_server::get_peer_info_all() const {
    std::vector<raft_server::peer_info> ret;
    if (!is_leader()) return ret;

    recur_lock(lock_);
    for (auto entry: peers_) {
        peer_info pi;
        ptr<peer> pp = entry.second;
        pi.id_ = pp->get_id();
        pi.last_log_idx_ = pp->get_last_accepted_log_idx();
        pi.last_succ_resp_us_ = pp->get_resp_timer_us();
        ret.push_back(pi);
    }
    return ret;
}